

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O1

char16 * __thiscall
Js::JavascriptString::GetNormalizedString
          (JavascriptString *this,NormalizationForm form,ArenaAllocator *tempAllocator,
          charcount_t *sizeOfNormalizedStringWithoutNullTerminator)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint destLength;
  BOOL BVar4;
  int32 iVar5;
  undefined4 extraout_var;
  undefined4 *puVar6;
  undefined4 extraout_var_00;
  char16 *destString;
  undefined4 extraout_var_01;
  char *message;
  charcount_t cVar7;
  uint lineNumber;
  size_t requestedBytes;
  ApiError local_34 [2];
  ApiError error;
  
  if (this->m_charLength == 0) {
    *sizeOfNormalizedStringWithoutNullTerminator = 0;
    return (char16 *)0x0;
  }
  scriptContext =
       (((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  iVar3 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])();
  bVar2 = PlatformAgnostic::UnicodeText::IsNormalizedString
                    (form,(char16 *)CONCAT44(extraout_var,iVar3),this->m_charLength);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xeb9,
                                "(!UnicodeText::IsNormalizedString(form, this->GetSz(), this->GetLength()))"
                                ,
                                "!UnicodeText::IsNormalizedString(form, this->GetSz(), this->GetLength())"
                               );
    if (!bVar2) goto LAB_00d24ec4;
    *puVar6 = 0;
  }
  iVar3 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(this);
  destLength = PlatformAgnostic::UnicodeText::NormalizeString
                         (form,(char16 *)CONCAT44(extraout_var_00,iVar3),this->m_charLength + 1,
                          (char16 *)0x0,0,local_34);
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  while (local_34[0] == InsufficientBuffer) {
    if (destLength == 0) {
      destString = (char16 *)&DAT_00000008;
    }
    else {
      requestedBytes = (long)(int)destLength * 2;
      if ((int)destLength < 0) {
        requestedBytes = 0xffffffffffffffff;
      }
      BVar4 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar2) goto LAB_00d24ec4;
        *puVar6 = 0;
      }
      destString = (char16 *)
                   Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                   AllocInternal(&tempAllocator->
                                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                 ,requestedBytes);
      if (destString == (char16 *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar2) goto LAB_00d24ec4;
        *puVar6 = 0;
      }
    }
    iVar3 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x65])(this);
    iVar5 = PlatformAgnostic::UnicodeText::NormalizeString
                      (form,(char16 *)CONCAT44(extraout_var_01,iVar3),this->m_charLength + 1,
                       destString,destLength,local_34);
    if (0 < iVar5) {
      cVar7 = iVar5 - 1;
      goto LAB_00d24ded;
    }
    destLength = -iVar5;
  }
  if (local_34[0] == NoError) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xedf,"(false)",
                                "This code path should not be hit, empty string case is handled above. Perhaps a false error (sizeEstimate <= 0; but lastError == 0; ERROR_SUCCESS and NO_ERRROR == 0)"
                               );
    if (bVar2) {
      *puVar6 = 0;
      cVar7 = 0;
      destString = (char16 *)0x0;
LAB_00d24ded:
      *sizeOfNormalizedStringWithoutNullTerminator = cVar7;
      return destString;
    }
  }
  else {
    if (local_34[0] == InvalidParameter) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      message = "Invalid Parameter- check pointers passed to NormalizeString";
      lineNumber = 0xed5;
    }
    else {
      if (local_34[0] == InvalidUnicodeText) {
        JavascriptError::ThrowRangeErrorVar(scriptContext,-0x7ff5ea1e,(ulong)destLength);
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      message = "Unknown error";
      lineNumber = 0xee4;
    }
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,lineNumber,"(false)",message);
    if (bVar2) {
      *puVar6 = 0;
      JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ea1d,(PCWSTR)0x0);
    }
  }
LAB_00d24ec4:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

char16* JavascriptString::GetNormalizedString(PlatformAgnostic::UnicodeText::NormalizationForm form, ArenaAllocator* tempAllocator, charcount_t& sizeOfNormalizedStringWithoutNullTerminator)
    {
        using namespace PlatformAgnostic;

        ScriptContext* scriptContext = this->GetScriptContext();
        if (this->GetLength() == 0)
        {
            sizeOfNormalizedStringWithoutNullTerminator = 0;
            return nullptr;
        }

        // IMPORTANT: Implementation Notes
        // Normalize string estimates the required size of the buffer based on averages and other data.
        // It is very hard to get a precise size from an input string without expanding/contracting it on the buffer.
        // It is estimated that the maximum size the string after an NFC is 6x the input length, and 18x for NFD. This approach isn't very feasible as well.
        // The approach taken is based on the simple example in the MSDN article.
        //  - Loop until the return value is either an error (apart from insufficient buffer size), or success.
        //  - Each time recreate a temporary buffer based on the last guess.
        //  - When creating the JS string, use the positive return value and copy the buffer across.
        // Design choice for "guesses" comes from data Windows collected; and in most cases the loop will not iterate more than 2 times.

        Assert(!UnicodeText::IsNormalizedString(form, this->GetSz(), this->GetLength()));

        //Get the first size estimate
        UnicodeText::ApiError error;
        int32 sizeEstimate = UnicodeText::NormalizeString(form, this->GetSz(), this->GetLength() + 1, nullptr, 0, &error);
        char16 *tmpBuffer = nullptr;
        //Loop while the size estimate is bigger than 0
        while (error == UnicodeText::ApiError::InsufficientBuffer)
        {
            tmpBuffer = AnewArray(tempAllocator, char16, sizeEstimate);
            sizeEstimate = UnicodeText::NormalizeString(form, this->GetSz(), this->GetLength() + 1, tmpBuffer, sizeEstimate, &error);

            // Success, sizeEstimate is the exact size including the null terminator
            if (sizeEstimate > 0)
            {
                sizeOfNormalizedStringWithoutNullTerminator = sizeEstimate - 1;
                return tmpBuffer;
            }

            // Anything less than 0, we have an error, flip sizeEstimate now. As both times we need to use it, we need positive anyways.
            sizeEstimate *= -1;

        }

        switch (error)
        {
            case UnicodeText::ApiError::InvalidParameter:
                //some invalid parameter, coding error
                AssertMsg(false, "Invalid Parameter- check pointers passed to NormalizeString");
                JavascriptError::ThrowRangeError(scriptContext, JSERR_FailedToNormalize);
                break;
            case UnicodeText::ApiError::InvalidUnicodeText:
                //the value returned is the negative index of an invalid unicode character
                JavascriptError::ThrowRangeErrorVar(scriptContext, JSERR_InvalidUnicodeCharacter, sizeEstimate);
                break;
            case UnicodeText::ApiError::NoError:
                //The actual size of the output string is zero.
                //Theoretically only empty input string should produce this, which is handled above, thus the code path should not be hit.
                AssertMsg(false, "This code path should not be hit, empty string case is handled above. Perhaps a false error (sizeEstimate <= 0; but lastError == 0; ERROR_SUCCESS and NO_ERRROR == 0)");
                sizeOfNormalizedStringWithoutNullTerminator = 0;
                return nullptr; // scriptContext->GetLibrary()->GetEmptyString();
                break;
            default:
                AssertMsg(false, "Unknown error");
                JavascriptError::ThrowRangeError(scriptContext, JSERR_FailedToNormalize);
                break;
        }
    }